

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethernet.cpp
# Opt level: O1

vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
* __thiscall
license::hw_identifier::Ethernet::alternative_ids
          (vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
           *__return_storage_ptr__,Ethernet *this)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  iterator iVar4;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  *this_00;
  Ethernet *pEVar5;
  FUNCTION_RETURN FVar6;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy;
  ulong uVar7;
  long lVar8;
  uchar *puVar9;
  uchar uVar10;
  uchar *puVar11;
  uchar *puVar12;
  uchar *puVar13;
  uchar *puVar14;
  iterator __begin2;
  _Type auVar15;
  array<unsigned_char,_7UL> *data_00;
  vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_> data;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  *identifiers;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> adapters;
  uchar auStack_48b [1019];
  undefined8 uStack_90;
  array<unsigned_char,_7UL> local_80;
  array<unsigned_char,_7UL> *local_78;
  iterator iStack_70;
  array<unsigned_char,_7UL> *local_68;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  *local_60;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> local_58;
  Ethernet *local_40;
  _Type local_38;
  
  local_68 = (array<unsigned_char,_7UL> *)0x0;
  local_78 = (array<unsigned_char,_7UL> *)0x0;
  iStack_70._M_current = (array<unsigned_char,_7UL> *)0x0;
  bVar2 = this->use_ip;
  local_58.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uStack_90 = 0x19fa64;
  local_60 = __return_storage_ptr__;
  FVar6 = os::getAdapterInfos(&local_58);
  local_40 = this;
  if (FVar6 == FUNC_RET_OK) {
    bVar3 = false;
    local_38 = (_Type)local_58.
                      super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (local_58.
        super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_58.
        super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar1 = (ulong)(bVar2 ^ 1) * 2 + 4;
      puVar13 = (uchar *)((long)local_58.
                                super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x406);
      puVar14 = (uchar *)((long)local_58.
                                super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x40c);
      auVar15 = (_Type)local_58.
                       super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_80._M_elems[0] = '\0';
        local_80._M_elems[1] = '\0';
        local_80._M_elems[2] = '\0';
        local_80._M_elems[3] = '\0';
        local_80._M_elems[4] = '\0';
        local_80._M_elems[5] = '\0';
        local_80._M_elems[6] = '\0';
        uVar7 = 1;
        puVar9 = puVar14;
        puVar11 = puVar13;
        do {
          puVar12 = puVar11;
          if (bVar2 != false) {
            puVar12 = puVar9;
          }
          if (uVar1 <= uVar7) break;
          uVar7 = uVar7 + 1;
          puVar11 = puVar11 + 1;
          puVar9 = puVar9 + 1;
        } while (*puVar12 == '\0');
        if (*puVar12 != '\0') {
          lVar8 = 0x40c;
          puVar9 = puVar13;
          do {
            uVar10 = '*';
            if (lVar8 - 0x40cU < uVar1) {
              puVar11 = puVar9 + 6;
              if (bVar2 == false) {
                puVar11 = puVar9;
              }
              uVar10 = *puVar11;
            }
            auStack_48b[lVar8] = uVar10;
            lVar8 = lVar8 + 1;
            puVar9 = puVar9 + 1;
          } while (lVar8 != 0x412);
          local_80._M_elems[0] = '\0';
          if (iStack_70._M_current == local_68) {
            uStack_90 = 0x19fb51;
            std::vector<std::array<unsigned_char,7ul>,std::allocator<std::array<unsigned_char,7ul>>>
            ::_M_realloc_insert<std::array<unsigned_char,7ul>const&>
                      ((vector<std::array<unsigned_char,7ul>,std::allocator<std::array<unsigned_char,7ul>>>
                        *)&local_78,iStack_70,&local_80);
          }
          else {
            *(undefined4 *)((iStack_70._M_current)->_M_elems + 3) = local_80._M_elems._3_4_;
            *(uint *)(iStack_70._M_current)->_M_elems =
                 (uint)CONCAT12(local_80._M_elems[3],local_80._M_elems._1_2_) << 8;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
        auVar15 = (_Type)((long)auVar15 + 0x414);
        puVar13 = puVar13 + 0x414;
        puVar14 = puVar14 + 0x414;
      } while (auVar15 != local_38);
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  this_00 = local_60;
  if ((_Type)local_58.
             super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start != (_Type)0x0) {
    uStack_90 = 0x19fb81;
    operator_delete(local_58.
                    super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pEVar5 = local_40;
  (this_00->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bVar3) {
    uStack_90 = 0x19fbba;
    std::
    vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    ::reserve(this_00,((long)iStack_70._M_current - (long)local_78) * 0x6db6db6db6db6db7);
    iVar4._M_current = (array<unsigned_char,_7UL> *)iStack_70;
    if (local_78 != iStack_70._M_current) {
      data_00 = local_78;
      do {
        uStack_90 = 0x19fbd6;
        HwIdentifier::HwIdentifier((HwIdentifier *)&local_58);
        uStack_90 = 0x19fbe0;
        strategy = (*(pEVar5->super_IdentificationStrategy)._vptr_IdentificationStrategy[2])(pEVar5)
        ;
        uStack_90 = 0x19fbea;
        HwIdentifier::set_identification_strategy((HwIdentifier *)&local_58,strategy);
        uStack_90 = 0x19fbf5;
        HwIdentifier::set_data((HwIdentifier *)&local_58,data_00);
        uStack_90 = 0x19fc00;
        std::
        vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
        ::push_back(this_00,(HwIdentifier *)&local_58);
        uStack_90 = 0x19fc08;
        HwIdentifier::~HwIdentifier((HwIdentifier *)&local_58);
        data_00 = data_00 + 1;
      } while (data_00 != iVar4._M_current);
    }
  }
  if (local_78 != (array<unsigned_char,_7UL> *)0x0) {
    uStack_90 = 0x19fc20;
    operator_delete(local_78);
  }
  return this_00;
}

Assistant:

std::vector<HwIdentifier> Ethernet::alternative_ids() const {
	vector<array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA>> data;
	FUNCTION_RETURN result = generate_ethernet_pc_id(data, use_ip);
	vector<HwIdentifier> identifiers;
	if (result == FUNC_RET_OK) {
		identifiers.reserve(data.size());
		for (auto &it : data) {
			HwIdentifier pc_id;
			pc_id.set_identification_strategy(identification_strategy());
			pc_id.set_data(it);
			identifiers.push_back(pc_id);
		}
	}
	return identifiers;
}